

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall crsGA::Logger::~Logger(Logger *this)

{
  ~Logger(this);
  operator_delete(this,0x120);
  return;
}

Assistant:

Logger::~Logger()
{
}